

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_soa.h
# Opt level: O3

GridSOA * embree::sse2::GridSOA::create<embree::BVHN<4>::Allocator_const>
                    (SubdivPatch1Base *patches,uint time_steps,uint x0,uint x1,uint y0,uint y1,
                    Scene *scene,Allocator *alloc,BBox3fa *bounds_o)

{
  FastAllocator *this;
  size_t *psVar1;
  atomic<unsigned_long> *paVar2;
  pointer *pppTVar3;
  BVHN<4> *pBVar4;
  ThreadLocal2 *this_00;
  iterator __position;
  MutexSys *pMVar5;
  MutexSys MVar6;
  size_t sVar7;
  long *plVar8;
  ThreadLocal2 *this_01;
  size_t sVar9;
  ulong uVar10;
  uint uVar11;
  size_t sVar12;
  uint uVar13;
  ulong uVar14;
  GridSOA *this_02;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_98;
  char local_90;
  Lock<embree::MutexSys> lock;
  GridRange range;
  MutexSys local_50;
  ulong local_48;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_40;
  range<int> local_38;
  
  uVar10 = (ulong)time_steps;
  uVar13 = x1 - x0;
  uVar11 = y1 - y0;
  range.u_start = 0;
  range.v_start = 0;
  range.u_end = uVar13;
  range.v_end = uVar11;
  if (time_steps == 1) {
    sVar7 = getBVHBytes(&range,0x80,0);
  }
  else {
    sVar12 = getBVHBytes(&range,0xe0,0);
    local_38._begin = 0;
    local_38._end = time_steps - 1;
    sVar7 = getTemporalBVHBytes(&local_38,0x100);
    sVar7 = sVar7 + sVar12 * (time_steps - 1);
  }
  plVar8 = (long *)__tls_get_addr(&PTR_021a7d38);
  this_01 = (ThreadLocal2 *)*plVar8;
  if (this_01 == (ThreadLocal2 *)0x0) {
    this_01 = (ThreadLocal2 *)alignedMalloc(0xc0,0x40);
    MutexSys::MutexSys((MutexSys *)this_01);
    (this_01->alloc)._M_b._M_p = (__pointer_type)0x0;
    (this_01->alloc0).parent = this_01;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc1).parent = this_01;
    (this_01->alloc1).ptr = (char *)0x0;
    (this_01->alloc1).cur = 0;
    (this_01->alloc1).end = 0;
    (this_01->alloc1).allocBlockSize = 0;
    (this_01->alloc1).bytesUsed = 0;
    (this_01->alloc1).bytesWasted = 0;
    *plVar8 = (long)this_01;
    lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    lock.locked = true;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    local_98._M_head_impl = this_01;
    std::
    vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
    ::
    emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
              ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                *)FastAllocator::s_thread_local_allocators,
               (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                *)&local_98);
    if (local_98._M_head_impl != (ThreadLocal2 *)0x0) {
      std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                ((default_delete<embree::FastAllocator::ThreadLocal2> *)&local_98,
                 local_98._M_head_impl);
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
  }
  sVar12 = (ulong)(uVar11 + 1) * (ulong)(uVar13 + 1) * 0x10;
  local_50.mutex = (void *)(sVar7 + (sVar12 + 8) * uVar10 + 0x30);
  pBVar4 = alloc->bvh;
  this = &pBVar4->alloc;
  this_00 = (this_01->alloc0).parent;
  local_48 = uVar10;
  if (this != (this_00->alloc)._M_b._M_p) {
    local_90 = '\x01';
    local_98._M_head_impl = this_00;
    MutexSys::lock(&this_00->mutex);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar2 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar2 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar2 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    (this_00->alloc0).allocBlockSize = (pBVar4->alloc).defaultBlockSize;
    (this_00->alloc1).ptr = (char *)0x0;
    (this_00->alloc1).cur = 0;
    (this_00->alloc1).end = 0;
    (this_00->alloc1).allocBlockSize = 0;
    (this_00->alloc1).bytesUsed = 0;
    (this_00->alloc1).bytesWasted = 0;
    (this_00->alloc1).allocBlockSize = (pBVar4->alloc).defaultBlockSize;
    LOCK();
    (this_00->alloc)._M_b._M_p = this;
    UNLOCK();
    lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    lock.locked = true;
    local_40._M_head_impl = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (pBVar4->alloc).thread_local_allocators.
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pBVar4->alloc).thread_local_allocators.
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(pBVar4->alloc).thread_local_allocators,__position,&local_40._M_head_impl);
    }
    else {
      *__position._M_current = this_00;
      pppTVar3 = &(pBVar4->alloc).thread_local_allocators.
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (local_90 == '\x01') {
      MutexSys::unlock(&(local_98._M_head_impl)->mutex);
    }
  }
  MVar6.mutex = local_50.mutex;
  psVar1 = &(this_01->alloc0).bytesUsed;
  *psVar1 = (long)local_50.mutex + *psVar1;
  sVar9 = (this_01->alloc0).cur;
  uVar10 = (ulong)(-(int)sVar9 & 0xf);
  uVar14 = (long)local_50.mutex + uVar10 + sVar9;
  (this_01->alloc0).cur = uVar14;
  if ((this_01->alloc0).end < uVar14) {
    (this_01->alloc0).cur = sVar9;
    pMVar5 = (MutexSys *)(this_01->alloc0).allocBlockSize;
    if ((MutexSys *)((long)local_50.mutex * 4) < pMVar5 ||
        (long)local_50.mutex * 4 - (long)pMVar5 == 0) {
      lock.mutex = pMVar5;
      this_02 = (GridSOA *)FastAllocator::malloc(this,(size_t)&lock);
      (this_01->alloc0).ptr = (char *)this_02;
      sVar9 = ((this_01->alloc0).end - (this_01->alloc0).cur) + (this_01->alloc0).bytesWasted;
      (this_01->alloc0).bytesWasted = sVar9;
      (this_01->alloc0).end = (size_t)lock.mutex;
      (this_01->alloc0).cur = (size_t)MVar6.mutex;
      if (lock.mutex < MVar6.mutex) {
        (this_01->alloc0).cur = 0;
        lock.mutex = (MutexSys *)(this_01->alloc0).allocBlockSize;
        this_02 = (GridSOA *)FastAllocator::malloc(this,(size_t)&lock);
        (this_01->alloc0).ptr = (char *)this_02;
        sVar9 = ((this_01->alloc0).end - (this_01->alloc0).cur) + (this_01->alloc0).bytesWasted;
        (this_01->alloc0).bytesWasted = sVar9;
        (this_01->alloc0).end = (size_t)lock.mutex;
        (this_01->alloc0).cur = (size_t)MVar6.mutex;
        if (lock.mutex < MVar6.mutex) {
          (this_01->alloc0).cur = 0;
          this_02 = (GridSOA *)0x0;
          goto LAB_00d7be43;
        }
      }
      (this_01->alloc0).bytesWasted = sVar9;
    }
    else {
      this_02 = (GridSOA *)FastAllocator::malloc(this,(size_t)&local_50);
    }
  }
  else {
    psVar1 = &(this_01->alloc0).bytesWasted;
    *psVar1 = *psVar1 + uVar10;
    this_02 = (GridSOA *)((this_01->alloc0).ptr + (uVar14 - (long)local_50.mutex));
  }
LAB_00d7be43:
  GridSOA(this_02,patches,(uint)local_48,x0,x1,y0,y1,(uint)patches->grid_u_res,
          (uint)patches->grid_v_res,(SubdivMesh *)(scene->geometries).items[patches->geom].ptr,sVar7
          ,sVar12,bounds_o);
  return this_02;
}

Assistant:

static GridSOA* create(const SubdivPatch1Base* patches, const unsigned time_steps,
                               unsigned x0, unsigned x1, unsigned y0, unsigned y1, 
                               const Scene* scene, Allocator& alloc, BBox3fa* bounds_o = nullptr)
      {
        const unsigned width = x1-x0+1;  
        const unsigned height = y1-y0+1; 
        const GridRange range(0,width-1,0,height-1);
        size_t bvhBytes = 0;
        if (time_steps == 1) 
          bvhBytes = getBVHBytes(range,sizeof(BVH4::AABBNode),0);
        else {
          bvhBytes = (time_steps-1)*getBVHBytes(range,sizeof(BVH4::AABBNodeMB),0);
          bvhBytes += getTemporalBVHBytes(make_range(0,int(time_steps-1)),sizeof(BVH4::AABBNodeMB4D));
        }
        const size_t gridBytes = 4*size_t(width)*size_t(height)*sizeof(float);  
        size_t rootBytes = time_steps*sizeof(BVH4::NodeRef);
#if !defined(__64BIT__)
        rootBytes += 4; // We read 2 elements behind the grid. As we store at least 8 root bytes after the grid we are fine in 64 bit mode. But in 32 bit mode we have to do additional padding.
#endif
        void* data = alloc(offsetof(GridSOA,data)+bvhBytes+time_steps*gridBytes+rootBytes);
        assert(data);
        return new (data) GridSOA(patches,time_steps,x0,x1,y0,y1,patches->grid_u_res,patches->grid_v_res,scene->get<SubdivMesh>(patches->geomID()),bvhBytes,gridBytes,bounds_o);
      }